

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O3

void __thiscall
TPZDohrPrecond<std::complex<double>,_TPZDohrSubstructCondense<std::complex<double>_>_>::ComputeV1
          (TPZDohrPrecond<std::complex<double>,_TPZDohrSubstructCondense<std::complex<double>_>_>
           *this,TPZFMatrix<std::complex<double>_> *x,TPZFMatrix<std::complex<double>_> *v1)

{
  list<TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_>_>_>
  *plVar1;
  long lVar2;
  long lVar3;
  complex<double> *pcVar4;
  ulong uVar5;
  _List_node_base *p_Var6;
  int iVar7;
  ulong uVar8;
  TPZFMatrix<std::complex<double>_> CoarseResidual_local;
  TPZFMatrix<std::complex<double>_> xloc;
  TPZFMatrix<std::complex<double>_> CoarseResidual;
  TPZFMatrix<std::complex<double>_> CoarseSolution_local;
  TPZFMatrix<std::complex<double>_> local_270;
  TPZFMatrix<std::complex<double>_> local_1e0;
  TPZFMatrix<std::complex<double>_> local_150;
  TPZFMatrix<std::complex<double>_> local_c0;
  
  lVar2 = this->fNumCoarse;
  lVar3 = (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
  local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01819c58;
  local_150.fElem = (complex<double> *)0x0;
  local_150.fGiven = (complex<double> *)0x0;
  local_150.fSize = 0;
  local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow = lVar2;
  local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol = lVar3;
  TPZVec<int>::TPZVec(&local_150.fPivot.super_TPZVec<int>,0);
  local_150.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_150.fPivot.super_TPZVec<int>.fStore = local_150.fPivot.fExtAlloc;
  local_150.fPivot.super_TPZVec<int>.fNElements = 0;
  local_150.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_150.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01819178;
  local_150.fWork.fStore = (complex<double> *)0x0;
  local_150.fWork.fNElements = 0;
  local_150.fWork.fNAlloc = 0;
  uVar8 = lVar3 * lVar2;
  if (uVar8 != 0) {
    uVar5 = 0xffffffffffffffff;
    if (uVar8 < 0x1000000000000000) {
      uVar5 = uVar8 * 0x10;
    }
    pcVar4 = (complex<double> *)operator_new__(uVar5);
    memset(pcVar4,0,uVar8 * 0x10);
    local_150.fElem = pcVar4;
  }
  memset(local_150.fElem,0,
         local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow *
         local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol * 0x10);
  local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix._24_2_ =
       local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix._24_2_ & 0xff00;
  plVar1 = &this->fGlobal;
  p_Var6 = (this->fGlobal).
           super__List_base<TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var6 != (_List_node_base *)plVar1) {
    iVar7 = 0;
    do {
      local_1e0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow = 0;
      local_1e0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol = 0;
      local_1e0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_1e0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_1e0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01819c58;
      local_1e0.fElem = (complex<double> *)0x0;
      local_1e0.fGiven = (complex<double> *)0x0;
      local_1e0.fSize = 0;
      TPZVec<int>::TPZVec(&local_1e0.fPivot.super_TPZVec<int>,0);
      local_1e0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
      local_1e0.fPivot.super_TPZVec<int>.fStore = local_1e0.fPivot.fExtAlloc;
      local_1e0.fPivot.super_TPZVec<int>.fNElements = 0;
      local_1e0.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_1e0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01819178;
      local_1e0.fWork.fNAlloc = 0;
      local_1e0.fWork.fStore = (complex<double> *)0x0;
      local_1e0.fWork.fNElements = 0;
      local_270.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow = 0;
      local_270.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol = 0;
      local_270.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_270.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_270.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01819c58;
      local_270.fSize = 0;
      local_270.fElem = (complex<double> *)0x0;
      local_270.fGiven = (complex<double> *)0x0;
      TPZVec<int>::TPZVec(&local_270.fPivot.super_TPZVec<int>,0);
      local_270.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
      local_270.fPivot.super_TPZVec<int>.fStore = local_270.fPivot.fExtAlloc;
      local_270.fPivot.super_TPZVec<int>.fNElements = 0;
      local_270.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_270.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01819178;
      local_270.fWork.fStore = (complex<double> *)0x0;
      local_270.fWork.fNElements = 0;
      local_270.fWork.fNAlloc = 0;
      TPZDohrAssembly<std::complex<double>_>::Extract
                (((this->fAssemble).fRef)->fPointer,iVar7,x,&local_1e0);
      TPZDohrSubstructCondense<std::complex<double>_>::Contribute_rc_local
                ((TPZDohrSubstructCondense<std::complex<double>_> *)(p_Var6[1]._M_next)->_M_next,
                 &local_1e0,&local_270);
      TPZDohrAssembly<std::complex<double>_>::AssembleCoarse
                (((this->fAssemble).fRef)->fPointer,iVar7,&local_270,&local_150);
      TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&local_270);
      TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&local_1e0);
      iVar7 = iVar7 + 1;
      p_Var6 = p_Var6->_M_next;
    } while (p_Var6 != (_List_node_base *)plVar1);
  }
  TPZStepSolver<std::complex<double>_>::SetDirect(this->fCoarse,ELDLt);
  lVar2 = this->fNumCoarse;
  lVar3 = (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
  local_1e0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1e0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1e0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01819c58;
  local_1e0.fElem = (complex<double> *)0x0;
  local_1e0.fGiven = (complex<double> *)0x0;
  local_1e0.fSize = 0;
  local_1e0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow = lVar2;
  local_1e0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol = lVar3;
  TPZVec<int>::TPZVec(&local_1e0.fPivot.super_TPZVec<int>,0);
  local_1e0.fPivot.super_TPZVec<int>.fStore = local_1e0.fPivot.fExtAlloc;
  local_1e0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_1e0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1e0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1e0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01819178;
  local_1e0.fWork.fStore = (complex<double> *)0x0;
  local_1e0.fWork.fNElements = 0;
  local_1e0.fWork.fNAlloc = 0;
  uVar8 = lVar3 * lVar2;
  if (uVar8 != 0) {
    uVar5 = 0xffffffffffffffff;
    if (uVar8 < 0x1000000000000000) {
      uVar5 = uVar8 * 0x10;
    }
    pcVar4 = (complex<double> *)operator_new__(uVar5);
    memset(pcVar4,0,uVar8 * 0x10);
    local_1e0.fElem = pcVar4;
  }
  (*(this->fCoarse->super_TPZMatrixSolver<std::complex<double>_>).super_TPZSolver.super_TPZSavable.
    _vptr_TPZSavable[0xb])(this->fCoarse,&local_150,&local_1e0);
  p_Var6 = (plVar1->
           super__List_base<TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_>_>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var6 != (_List_node_base *)plVar1) {
    iVar7 = 0;
    do {
      local_270.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow = 0;
      local_270.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol = 0;
      local_270.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_270.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_270.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01819c58;
      local_270.fElem = (complex<double> *)0x0;
      local_270.fGiven = (complex<double> *)0x0;
      local_270.fSize = 0;
      TPZVec<int>::TPZVec(&local_270.fPivot.super_TPZVec<int>,0);
      local_270.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
      local_270.fPivot.super_TPZVec<int>.fStore = local_270.fPivot.fExtAlloc;
      local_270.fPivot.super_TPZVec<int>.fNElements = 0;
      local_270.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_270.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01819178;
      local_270.fWork.fNAlloc = 0;
      local_270.fWork.fStore = (complex<double> *)0x0;
      local_270.fWork.fNElements = 0;
      local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow = 0;
      local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol = 0;
      local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01819c58;
      local_c0.fSize = 0;
      local_c0.fElem = (complex<double> *)0x0;
      local_c0.fGiven = (complex<double> *)0x0;
      TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
      local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
      local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
      local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
      local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01819178;
      local_c0.fWork.fStore = (complex<double> *)0x0;
      local_c0.fWork.fNElements = 0;
      local_c0.fWork.fNAlloc = 0;
      TPZDohrAssembly<std::complex<double>_>::ExtractCoarse
                (((this->fAssemble).fRef)->fPointer,iVar7,&local_1e0,&local_c0);
      TPZDohrSubstructCondense<std::complex<double>_>::Contribute_v1_local
                ((TPZDohrSubstructCondense<std::complex<double>_> *)(p_Var6[1]._M_next)->_M_next,
                 &local_270,&local_c0);
      TPZDohrAssembly<std::complex<double>_>::Assemble
                (((this->fAssemble).fRef)->fPointer,iVar7,&local_270,v1);
      TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&local_c0);
      TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&local_270);
      iVar7 = iVar7 + 1;
      p_Var6 = p_Var6->_M_next;
    } while (p_Var6 != (_List_node_base *)plVar1);
  }
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&local_1e0);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&local_150);
  return;
}

Assistant:

void TPZDohrPrecond<TVar, TSubStruct>::ComputeV1(const TPZFMatrix<TVar> &x, TPZFMatrix<TVar> &v1) const
{
	/* Computing r(c) */
	TPZFMatrix<TVar> CoarseResidual(fNumCoarse,x.Cols());
	CoarseResidual.Zero();
	typename std::list<TPZAutoPointer<TSubStruct> >::const_iterator it;
	
	int isub = 0;
	for(it= fGlobal.begin(); it != fGlobal.end(); it++, isub++) {
		TPZFMatrix<TVar> xloc, CoarseResidual_local;
		fAssemble->Extract(isub,x,xloc);
		//		(*it)->LoadWeightedResidual(xloc);
		(*it)->Contribute_rc_local(xloc,CoarseResidual_local);
		fAssemble->AssembleCoarse(isub,CoarseResidual_local,CoarseResidual);
	}
#ifdef PZ_LOG
	{
		std::stringstream sout;
		CoarseResidual.Print("Coarse Residual",sout);
		if (logger.isDebugEnabled())
		{
			LOGPZ_DEBUG(logger, sout.str());
		}
	}
#endif
	/* Computing K(c)_inverted*r(c) and stores it in "product" */
	fCoarse->SetDirect(ELDLt);
	//Dado global
	TPZFMatrix<TVar> CoarseSolution(fNumCoarse,x.Cols());
	fCoarse->Solve(CoarseResidual,CoarseSolution);
#ifdef PZ_LOG
	{
		std::stringstream sout;
		CoarseSolution.Print("CoarseSolution",sout);
		if (logger.isDebugEnabled())
		{
			LOGPZ_DEBUG(logger, sout.str());
		}
	}
#endif
	isub=0;
	//Criar tarefa que execute a distribuicao de cada elemento do fGlobal
	for(it= fGlobal.begin(); it != fGlobal.end(); it++,isub++)
	{
		// Gerenciamento Global->Local sobre o product
		//product é administrado pelo DM mas permanece no processador 0
		// tarefa separada, expansao da solucao coarse
		TPZFMatrix<TVar> v1_local,CoarseSolution_local;
		fAssemble->ExtractCoarse(isub,CoarseSolution,CoarseSolution_local);
		(*it)->Contribute_v1_local(v1_local,CoarseSolution_local);
		
		fAssemble->Assemble(isub,v1_local,v1);
	}
#ifdef PZ_LOG
	{
		std::stringstream sout;
		v1.Print("v1 vector",sout);
		if (loggerv1v2.isDebugEnabled())
		{
			LOGPZ_DEBUG(loggerv1v2, sout.str())
		}
	}
#endif
}